

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTextureOrNull
          (TextureParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  pointer pcVar1;
  long lVar2;
  char *pcVar3;
  size_t __n;
  RGBColorSpace *pRVar4;
  undefined1 auVar5 [16];
  polymorphic_allocator<pbrt::ParsedParameter_*> pVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  const_iterator cVar10;
  RGBSpectrum *this_00;
  ulong uVar11;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer pcVar12;
  char *pcVar13;
  long *in_R8;
  long lVar14;
  bool bVar15;
  SpectrumHandle s;
  ParameterDictionary *local_80;
  RGB local_50;
  long *local_40;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_38;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_00000014,spectrumType);
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar12 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar12 = *(pointer *)(pcVar1 + 8);
  }
  local_80 = this->dict;
  bVar15 = lVar2 == 0;
  if (!bVar15) {
    lVar14 = 0;
    local_40 = in_R8;
    do {
      pcVar3 = *(char **)(pcVar12 + lVar14);
      __n = *(size_t *)(pcVar3 + 0x28);
      iVar8 = 3;
      if ((__n == args->_M_string_length) &&
         ((args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pcVar3 + 0x20), __n == 0 ||
          (iVar7 = bcmp((args_1->_M_dataplus)._M_p,(args->_M_dataplus)._M_p,__n), iVar8 = 3,
          iVar7 == 0)))) {
        iVar8 = std::__cxx11::string::compare(pcVar3);
        if (iVar8 == 0) {
          if (*(long *)(pcVar3 + 0x90) != 1) {
            if (*(long *)(pcVar3 + 0x90) == 0) {
              this->dict = local_80;
              pcVar13 = "No texture name provided for parameter \"%s\".";
            }
            else {
              this->dict = local_80;
              pcVar13 = "More than one texture name provided for parameter \"%s\".";
            }
            ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar3 + 0x40),pcVar13,args);
          }
          pcVar3[0xb8] = '\x01';
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                           *)(name->field_2)._M_allocated_capacity,*(key_type **)(pcVar3 + 0x80));
          if (cVar10._M_node == (_Base_ptr)((name->field_2)._M_allocated_capacity + 8)) {
            this->dict = local_80;
            ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((FileLoc *)(pcVar3 + 0x40),
                       "Couldn\'t find spectrum texture named \"%s\" for parameter \"%s\"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pcVar3 + 0x80),args_1);
          }
          local_80 = *(ParameterDictionary **)(cVar10._M_node + 2);
        }
        else {
          iVar8 = std::__cxx11::string::compare(pcVar3);
          if (iVar8 == 0) {
            if (*(long *)(pcVar3 + 0x70) != 3) {
              this->dict = local_80;
              pcVar13 = "Didn\'t find three values for \"rgb\" parameter \"%s\".";
LAB_003b1f2a:
              ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar3 + 0x40),pcVar13,args_1);
            }
            pcVar3[0xb8] = '\x01';
            local_50.b = (Float)*(double *)(*(undefined1 (**) [16])(pcVar3 + 0x60))[1];
            auVar5 = vcvtpd2ps_avx(**(undefined1 (**) [16])(pcVar3 + 0x60));
            local_50._0_8_ = vmovlps_avx(auVar5);
            if (((auVar5._0_4_ < 0.0) || (auVar5 = vmovshdup_avx(auVar5), auVar5._0_4_ < 0.0)) ||
               (local_50.b < 0.0)) {
              this->dict = local_80;
              pcVar13 = "Negative value provided for \"rgb\" parameter \"%s\".";
              goto LAB_003b1f2a;
            }
            if ((int)alloc.memoryResource == 0) {
              pRVar4 = *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60);
              this_00 = (RGBSpectrum *)(**(code **)(*local_40 + 0x10))(local_40,0x1c,4);
              RGBReflectanceSpectrum::RGBReflectanceSpectrum
                        ((RGBReflectanceSpectrum *)this_00,pRVar4,&local_50);
              uVar11 = 0x2000000000000;
            }
            else {
              if ((int)alloc.memoryResource != 1) {
                this->dict = local_80;
                LogFatal<char_const(&)[42]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                           ,0x349,"Check failed: %s",
                           (char (*) [42])"spectrumType == SpectrumType::Reflectance");
              }
              pRVar4 = *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60);
              this_00 = (RGBSpectrum *)(**(code **)(*local_40 + 0x10))(local_40,0x28,8);
              RGBSpectrum::RGBSpectrum(this_00,pRVar4,&local_50);
              uVar11 = 0x1000000000000;
            }
            local_80 = (ParameterDictionary *)((ulong)this_00 | uVar11);
          }
          else {
            iVar8 = std::__cxx11::string::compare(pcVar3);
            if (iVar8 != 0) {
              iVar7 = std::__cxx11::string::compare(pcVar3);
              iVar8 = 0;
              if (iVar7 != 0) goto LAB_003b1e0c;
            }
            plVar9 = local_40;
            local_50.r = 0.0;
            local_50.g = 0.0;
            ParameterDictionary::GetOneSpectrum
                      ((ParameterDictionary *)&stack0xffffffffffffffc8,
                       (string *)(name->_M_dataplus)._M_p,(SpectrumHandle *)args,
                       (SpectrumType)&local_50,
                       (memory_resource *)((ulong)alloc.memoryResource & 0xffffffff));
            pVar6.memoryResource = local_38.memoryResource;
            if (local_38.memoryResource == (memory_resource *)0x0) {
              this->dict = local_80;
              LogFatal<char_const(&)[13]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                         ,0x34f,"Check failed: %s",(char (*) [13])0x5e6429);
            }
            plVar9 = (long *)(**(code **)(*plVar9 + 0x10))(plVar9,8,8);
            *plVar9 = (long)pVar6.memoryResource;
            local_80 = (ParameterDictionary *)((ulong)plVar9 | 0x7000000000000);
          }
        }
        iVar8 = 1;
      }
LAB_003b1e0c:
      if ((iVar8 != 3) && (iVar8 != 0)) {
        if (!bVar15) goto LAB_003b1e37;
        goto LAB_003b1e35;
      }
      lVar14 = lVar14 + 8;
      bVar15 = lVar2 << 3 == lVar14;
    } while (!bVar15);
  }
  this->dict = local_80;
LAB_003b1e35:
  local_80 = (ParameterDictionary *)0x0;
LAB_003b1e37:
  this->dict = local_80;
  return (SpectrumTextureHandle)this;
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTextureOrNull(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = spectrumTextures->find(p->strings[0]);
            if (iter != spectrumTextures->end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find spectrum texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "rgb") {
            if (p->numbers.size() != 3)
                ErrorExit(&p->loc,
                          "Didn't find three values for \"rgb\" parameter \"%s\".",
                          p->name);
            p->lookedUp = true;

            RGB rgb(p->numbers[0], p->numbers[1], p->numbers[2]);
            if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                ErrorExit(&p->loc,
                          "Negative value provided for \"rgb\" parameter \"%s\".",
                          p->name);
            if (spectrumType == SpectrumType::General)
                return alloc.new_object<RGBConstantTexture>(*dict->ColorSpace(), rgb);
            else {
                CHECK(spectrumType == SpectrumType::Reflectance);
                return alloc.new_object<RGBReflectanceConstantTexture>(
                    *dict->ColorSpace(), rgb);
            }
        } else if (p->type == "spectrum" || p->type == "blackbody") {
            SpectrumHandle s = GetOneSpectrum(name, nullptr, spectrumType, alloc);
            CHECK(s != nullptr);
            return alloc.new_object<SpectrumConstantTexture>(s);
        }
    }

    return nullptr;
}